

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# collision_frontend.cpp
# Opt level: O1

void __thiscall
CollisionFrontend::print_broad_clash_counts
          (CollisionFrontend *this,Structure *Conf,vector<int,_std::allocator<int>_> *starts,
          vector<int,_std::allocator<int>_> *ends,bool b_ignore_self)

{
  AtomFlavor AVar1;
  uint uVar2;
  bool bVar3;
  bool bVar4;
  bool bVar5;
  ulong uVar6;
  undefined2 uVar7;
  int iVar8;
  __node_base _Var9;
  ulong uVar10;
  ostream *poVar11;
  long *plVar12;
  long lVar13;
  uint *puVar14;
  char *__function;
  Atom *pAVar15;
  char *__file;
  uint uVar16;
  ulong uVar17;
  char *__assertion;
  undefined7 in_register_00000081;
  int delta_res;
  Structure *pSVar18;
  uint uVar19;
  long lVar20;
  Residue *pRVar21;
  short sVar22;
  short sVar23;
  uint uVar24;
  int iVar25;
  filter_results_t nearby_atoms;
  undefined2 local_14a;
  int local_148 [2];
  undefined8 uStack_140;
  undefined8 local_138;
  undefined1 local_125;
  uint local_124;
  int local_120;
  int local_11c;
  ulong local_118;
  int local_10c;
  Structure *local_108;
  ulong local_100;
  vector<collision_grid_prot::atom_key,_std::allocator<collision_grid_prot::atom_key>_> local_f8;
  CollisionFrontend *local_e0;
  int local_d8;
  int local_d4;
  uint local_d0;
  uint local_cc;
  int local_c8;
  undefined4 local_c4;
  vector<int,_std::allocator<int>_> *local_c0;
  ulong local_b8;
  long local_b0;
  vector<int,_std::allocator<int>_> *local_a8;
  long local_a0;
  ulong local_98;
  long local_90;
  collision_grid *local_88;
  Membrane *local_80;
  Residue *local_78;
  Atom *local_70;
  _Hashtable<unsigned_int,_unsigned_int,_std::allocator<unsigned_int>,_std::__detail::_Identity,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
  local_68;
  
  local_c4 = (undefined4)CONCAT71(in_register_00000081,b_ignore_self);
  local_108 = Conf;
  local_e0 = this;
  local_c0 = ends;
  if ((long)(starts->super__Vector_base<int,_std::allocator<int>_>)._M_impl.super__Vector_impl_data.
            _M_finish -
      (long)(starts->super__Vector_base<int,_std::allocator<int>_>)._M_impl.super__Vector_impl_data.
            _M_start !=
      (long)(ends->super__Vector_base<int,_std::allocator<int>_>)._M_impl.super__Vector_impl_data.
            _M_finish -
      (long)(ends->super__Vector_base<int,_std::allocator<int>_>)._M_impl.super__Vector_impl_data.
            _M_start) {
    __assert_fail("starts.size() == ends.size()",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/uic-lianglab[P]ompg-public/source/collision_frontend.cpp"
                  ,0x1e5,
                  "void CollisionFrontend::print_broad_clash_counts(const class Structure &, const std::vector<int> &, const std::vector<int> &, const bool) const"
                 );
  }
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cout,"res,bbc,scc,tot,mc\n",0x13);
  local_148[0] = 0;
  local_148[1] = 0;
  uStack_140 = 0;
  local_138 = 0;
  lVar13 = (long)(starts->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                 super__Vector_impl_data._M_finish -
           (long)(starts->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                 super__Vector_impl_data._M_start;
  if (lVar13 == 0) {
    iVar8 = 0;
    iVar25 = 0;
    uVar10 = 0;
  }
  else {
    lVar13 = lVar13 >> 2;
    local_80 = &local_e0->m_membrane;
    local_88 = &(local_e0->m_broad_phase).m_impl;
    lVar13 = lVar13 + (ulong)(lVar13 == 0);
    uVar10 = 0;
    iVar25 = 0;
    iVar8 = 0;
    lVar20 = 0;
    local_b0 = lVar13;
    local_a8 = starts;
    do {
      uVar16 = (starts->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
               super__Vector_impl_data._M_start[lVar20];
      uVar17 = (ulong)(int)uVar16;
      if (uVar16 <= (uint)(local_c0->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                          super__Vector_impl_data._M_start[lVar20]) {
        local_10c = local_148[0];
        local_14a = (undefined2)uStack_140;
        uVar16 = local_148[1];
        sVar22 = local_138._4_2_;
        local_a0 = lVar20;
        do {
          if (uVar17 != (long)local_108->_res[uVar17]._posn) {
            uStack_140 = CONCAT62(uStack_140._2_6_,local_14a);
            local_138._0_6_ = CONCAT24(sVar22,(undefined4)local_138);
            __assert_fail("res._posn == i_res",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/uic-lianglab[P]ompg-public/source/collision_frontend.cpp"
                          ,0x1fd,
                          "void CollisionFrontend::print_broad_clash_counts(const class Structure &, const std::vector<int> &, const std::vector<int> &, const bool) const"
                         );
          }
          pRVar21 = local_108->_res + uVar17;
          local_d8 = iVar25;
          local_d4 = iVar8;
          local_98 = uVar10;
          if (pRVar21->_numAtom < 1) {
            local_100 = 0;
            local_118 = 0;
            local_120 = 0;
          }
          else {
            local_c8 = (int)uVar17 + -2;
            uVar24 = 0;
            local_90 = (long)(int)uVar17 * 0x150;
            local_120 = 0;
            local_118 = 0;
            local_100 = 0;
            local_11c = local_10c;
            pSVar18 = local_108;
            local_b8 = uVar17;
            local_78 = pRVar21;
            do {
              pAVar15 = pRVar21->_atom;
              bVar4 = pAVar15[(int)uVar24].super_Point.x != 0.0;
              bVar5 = pAVar15[(int)uVar24].super_Point.y != 0.0;
              bVar3 = pAVar15[(int)uVar24].super_Point.z != 0.0;
              iVar8 = pAVar15[(int)uVar24]._type;
              if (iVar8 < 1 && (bVar3 || (bVar5 || bVar4))) {
LAB_0011c5f6:
                uStack_140 = CONCAT62(uStack_140._2_6_,local_14a);
                local_138._0_6_ = CONCAT24(sVar22,(undefined4)local_138);
                __assert_fail("atom.is_at_origin() || (atom._type > 0)",
                              "/workspace/llm4binary/github/license_all_cmakelists_25/uic-lianglab[P]ompg-public/source/vdw_utils.h"
                              ,0x36,"static unsigned int VdwUtils::should_ignore_atom(const Atom &)"
                             );
              }
              if (0x1d < iVar8 && (bVar3 || (bVar5 || bVar4))) {
LAB_0011c5c7:
                uStack_140 = CONCAT62(uStack_140._2_6_,local_14a);
                local_138._0_6_ = CONCAT24(sVar22,(undefined4)local_138);
                __assert_fail("atom.is_at_origin() || (atom._type < DISGRO_MAX_ATOM_TYPES)",
                              "/workspace/llm4binary/github/license_all_cmakelists_25/uic-lianglab[P]ompg-public/source/vdw_utils.h"
                              ,0x37,"static unsigned int VdwUtils::should_ignore_atom(const Atom &)"
                             );
              }
              if (((bVar3 || (bVar5 || bVar4)) &&
                  (VdwUtils::disgro_atom_type_to_CHONS[iVar8] != AF_H)) &&
                 (VdwUtils::disgro_atom_type_to_CHONS[iVar8] != AF_UNDEF)) {
                if (uVar24 < 6) {
                  iVar8 = (int)uVar17;
                  local_148[0] = iVar8;
                  if ((long)uVar17 < 1) {
                    uStack_140 = CONCAT62(uStack_140._2_6_,local_14a);
                    local_138._0_6_ = CONCAT24(sVar22,(undefined4)local_138);
                    __assert_fail("infos[e1_3_gobbo].res_ix >= 1",
                                  "/workspace/llm4binary/github/license_all_cmakelists_25/uic-lianglab[P]ompg-public/source/collision_frontend.cpp"
                                  ,0x211,
                                  "void CollisionFrontend::print_broad_clash_counts(const class Structure &, const std::vector<int> &, const std::vector<int> &, const bool) const"
                                 );
                  }
                  if (pSVar18->_numRes < iVar8) {
                    uStack_140 = CONCAT62(uStack_140._2_6_,local_14a);
                    local_138._0_6_ = CONCAT24(sVar22,(undefined4)local_138);
                    __assert_fail("infos[e1_3_gobbo].res_ix <= Conf._numRes",
                                  "/workspace/llm4binary/github/license_all_cmakelists_25/uic-lianglab[P]ompg-public/source/collision_frontend.cpp"
                                  ,0x212,
                                  "void CollisionFrontend::print_broad_clash_counts(const class Structure &, const std::vector<int> &, const std::vector<int> &, const bool) const"
                                 );
                  }
                  local_148[1] = uVar24;
                  local_14a = *(undefined2 *)((long)pSVar18->_res->_scChi + local_90 + -0x20);
                  uVar16 = uVar24;
                  local_11c = iVar8;
                  local_10c = iVar8;
                }
                local_124 = uVar16;
                pAVar15 = pAVar15 + (int)uVar24;
                iVar8 = Membrane::collides(local_80,pAVar15,local_e0->m_ofac2[2]);
                local_f8.
                super__Vector_base<collision_grid_prot::atom_key,_std::allocator<collision_grid_prot::atom_key>_>
                ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
                local_f8.
                super__Vector_base<collision_grid_prot::atom_key,_std::allocator<collision_grid_prot::atom_key>_>
                ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
                local_f8.
                super__Vector_base<collision_grid_prot::atom_key,_std::allocator<collision_grid_prot::atom_key>_>
                ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
                sVar23 = (short)pAVar15->_type;
                if (sVar23 < 1) {
                  uStack_140 = CONCAT62(uStack_140._2_6_,local_14a);
                  local_138._0_6_ = CONCAT24(sVar22,(undefined4)local_138);
                  __assert_fail("dg_atom_type > 0",
                                "/workspace/llm4binary/github/license_all_cmakelists_25/uic-lianglab[P]ompg-public/source/vdw_utils.h"
                                ,0x88,"double DG_ATOM_TYPE_TO_VDW_RADIUS(const short)");
                }
                if (0x1d < sVar23) {
                  uStack_140 = CONCAT62(uStack_140._2_6_,local_14a);
                  local_138._0_6_ = CONCAT24(sVar22,(undefined4)local_138);
                  __assert_fail("dg_atom_type < DISGRO_MAX_ATOM_TYPES",
                                "/workspace/llm4binary/github/license_all_cmakelists_25/uic-lianglab[P]ompg-public/source/vdw_utils.h"
                                ,0x89,"double DG_ATOM_TYPE_TO_VDW_RADIUS(const short)");
                }
                AVar1 = VdwUtils::disgro_atom_type_to_CHONS[pAVar15->_type & 0x7fff];
                if ((long)(int)AVar1 < 0) {
                  uStack_140 = CONCAT62(uStack_140._2_6_,local_14a);
                  local_138._0_6_ = CONCAT24(sVar22,(undefined4)local_138);
                  __assert_fail("VdwUtils::disgro_atom_type_to_CHONS[dg_atom_type] >= 0",
                                "/workspace/llm4binary/github/license_all_cmakelists_25/uic-lianglab[P]ompg-public/source/vdw_utils.h"
                                ,0x8a,"double DG_ATOM_TYPE_TO_VDW_RADIUS(const short)");
                }
                if (7 < (int)AVar1) {
                  local_138._0_6_ = CONCAT24(sVar22,(undefined4)local_138);
                  __assertion = 
                  "VdwUtils::disgro_atom_type_to_CHONS[dg_atom_type] < VdwUtils::AF_NUM";
                  __file = 
                  "/workspace/llm4binary/github/license_all_cmakelists_25/uic-lianglab[P]ompg-public/source/vdw_utils.h"
                  ;
                  __function = "double DG_ATOM_TYPE_TO_VDW_RADIUS(const short)";
LAB_0011c7bd:
                  uStack_140 = CONCAT62(uStack_140._2_6_,local_14a);
                  __assert_fail(__assertion,__file,0x8b,__function);
                }
                local_f8.
                super__Vector_base<collision_grid_prot::atom_key,_std::allocator<collision_grid_prot::atom_key>_>
                ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
                local_68._M_buckets = &local_68._M_single_bucket;
                local_68._M_bucket_count = 1;
                local_68._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
                local_68._M_element_count = 0;
                local_68._M_rehash_policy._M_max_load_factor = 1.0;
                local_68._M_rehash_policy._M_next_resize = 0;
                local_68._M_single_bucket = (__node_base_ptr)0x0;
                local_120 = (local_120 + 1) - (uint)(iVar8 == 0);
                collision_grid::filter
                          (local_88,(element_set_t *)&local_68,(pAVar15->super_Point).x,
                           (pAVar15->super_Point).y,(pAVar15->super_Point).z,
                           VdwUtils::atom_flavor_to_vdw_radius[(int)AVar1]);
                if ((local_68._M_element_count != 0) &&
                   (std::
                    vector<collision_grid_prot::atom_key,_std::allocator<collision_grid_prot::atom_key>_>
                    ::resize(&local_f8,local_68._M_element_count),
                   local_68._M_before_begin._M_nxt != (_Hash_node_base *)0x0)) {
                  puVar14 = &(local_f8.
                              super__Vector_base<collision_grid_prot::atom_key,_std::allocator<collision_grid_prot::atom_key>_>
                              ._M_impl.super__Vector_impl_data._M_start)->atom_ix;
                  _Var9._M_nxt = local_68._M_before_begin._M_nxt;
                  do {
                    uVar16 = *(uint *)&_Var9._M_nxt[1]._M_nxt;
                    *puVar14 = uVar16 & 0xf;
                    ((atom_key *)(puVar14 + -1))->res_ix = uVar16 >> 4;
                    _Var9._M_nxt = (_Var9._M_nxt)->_M_nxt;
                    puVar14 = puVar14 + 2;
                  } while (_Var9._M_nxt != (_Hash_node_base *)0x0);
                }
                local_70 = pAVar15;
                std::
                _Hashtable<unsigned_int,_unsigned_int,_std::allocator<unsigned_int>,_std::__detail::_Identity,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
                ::~_Hashtable(&local_68);
                if ((long)local_f8.
                          super__Vector_base<collision_grid_prot::atom_key,_std::allocator<collision_grid_prot::atom_key>_>
                          ._M_impl.super__Vector_impl_data._M_finish -
                    (long)local_f8.
                          super__Vector_base<collision_grid_prot::atom_key,_std::allocator<collision_grid_prot::atom_key>_>
                          ._M_impl.super__Vector_impl_data._M_start != 0) {
                  local_cc = (uint)(uVar24 >= 6);
                  local_d0 = (uint)(uVar24 < 6);
                  lVar13 = (long)local_f8.
                                 super__Vector_base<collision_grid_prot::atom_key,_std::allocator<collision_grid_prot::atom_key>_>
                                 ._M_impl.super__Vector_impl_data._M_finish -
                           (long)local_f8.
                                 super__Vector_base<collision_grid_prot::atom_key,_std::allocator<collision_grid_prot::atom_key>_>
                                 ._M_impl.super__Vector_impl_data._M_start >> 3;
                  lVar20 = 0;
                  do {
                    uVar16 = local_f8.
                             super__Vector_base<collision_grid_prot::atom_key,_std::allocator<collision_grid_prot::atom_key>_>
                             ._M_impl.super__Vector_impl_data._M_start[lVar20].res_ix;
                    uVar10 = (ulong)uVar16;
                    uVar7 = local_138._6_2_;
                    if (uVar10 == 0) {
                      uStack_140 = CONCAT62(uStack_140._2_6_,local_14a);
                      local_138._0_6_ = CONCAT24(sVar22,(undefined4)local_138);
                      __assert_fail("nearby_atom_key.res_ix >= 1",
                                    "/workspace/llm4binary/github/license_all_cmakelists_25/uic-lianglab[P]ompg-public/source/collision_frontend.cpp"
                                    ,0x226,
                                    "void CollisionFrontend::print_broad_clash_counts(const class Structure &, const std::vector<int> &, const std::vector<int> &, const bool) const"
                                   );
                    }
                    if ((uint)pSVar18->_numRes < uVar16) {
                      uStack_140 = CONCAT62(uStack_140._2_6_,local_14a);
                      local_138._0_6_ = CONCAT24(sVar22,(undefined4)local_138);
                      __assert_fail("nearby_atom_key.res_ix <= static_cast<unsigned int>(Conf._numRes)"
                                    ,
                                    "/workspace/llm4binary/github/license_all_cmakelists_25/uic-lianglab[P]ompg-public/source/collision_frontend.cpp"
                                    ,0x227,
                                    "void CollisionFrontend::print_broad_clash_counts(const class Structure &, const std::vector<int> &, const std::vector<int> &, const bool) const"
                                   );
                    }
                    uVar2 = local_f8.
                            super__Vector_base<collision_grid_prot::atom_key,_std::allocator<collision_grid_prot::atom_key>_>
                            ._M_impl.super__Vector_impl_data._M_start[lVar20].atom_ix;
                    pRVar21 = pSVar18->_res;
                    if ((uint)(int)pRVar21[uVar10]._numAtom <= uVar2) {
                      uStack_140 = CONCAT62(uStack_140._2_6_,local_14a);
                      local_138._0_6_ = CONCAT24(sVar22,(undefined4)local_138);
                      __assert_fail("nearby_atom_key.atom_ix < static_cast<unsigned int>(Conf._res[nearby_atom_key.res_ix]._numAtom)"
                                    ,
                                    "/workspace/llm4binary/github/license_all_cmakelists_25/uic-lianglab[P]ompg-public/source/collision_frontend.cpp"
                                    ,0x229,
                                    "void CollisionFrontend::print_broad_clash_counts(const class Structure &, const std::vector<int> &, const std::vector<int> &, const bool) const"
                                   );
                    }
                    pAVar15 = pRVar21[uVar10]._atom;
                    bVar4 = pAVar15[uVar2].super_Point.x == 0.0;
                    bVar5 = pAVar15[uVar2].super_Point.y == 0.0;
                    bVar3 = pAVar15[uVar2].super_Point.z == 0.0;
                    iVar8 = pAVar15[uVar2]._type;
                    if (iVar8 < 1 && (!bVar3 || (!bVar5 || !bVar4))) goto LAB_0011c5f6;
                    if (0x1d < iVar8 && (!bVar3 || (!bVar5 || !bVar4))) goto LAB_0011c5c7;
                    if (((bVar3 && (bVar5 && bVar4)) ||
                        (VdwUtils::disgro_atom_type_to_CHONS[iVar8] == AF_UNDEF)) ||
                       (VdwUtils::disgro_atom_type_to_CHONS[iVar8] == AF_H)) {
                      uStack_140 = CONCAT62(uStack_140._2_6_,local_14a);
                      local_138._0_6_ = CONCAT24(sVar22,(undefined4)local_138);
                      __assert_fail("!VdwUtils::should_ignore_atom(nearby_atom)",
                                    "/workspace/llm4binary/github/license_all_cmakelists_25/uic-lianglab[P]ompg-public/source/collision_frontend.cpp"
                                    ,0x22b,
                                    "void CollisionFrontend::print_broad_clash_counts(const class Structure &, const std::vector<int> &, const std::vector<int> &, const bool) const"
                                   );
                    }
                    iVar8 = 0xd;
                    if (((byte)local_c4 & uVar17 == uVar10) == 0) {
                      if (uVar24 < 6) {
                        uStack_140 = CONCAT44(uVar16,(undefined4)uStack_140);
                        local_138 = CONCAT44(local_138._4_4_,uVar2);
                        sVar22 = pRVar21[uVar10]._type;
                        if ((int)local_124 < 0) {
                          local_138._0_6_ = CONCAT24(sVar22,uVar2);
                          local_138 = CONCAT26(uVar7,(undefined6)local_138);
                          __assertion = "infos[e1_3_gobbo].atom_ix >= 0";
                          __file = 
                          "/workspace/llm4binary/github/license_all_cmakelists_25/uic-lianglab[P]ompg-public/source/collision_frontend.cpp"
                          ;
                          __function = 
                          "int (anonymous namespace)::gobbo_are_1_3_connected(const struct atom_info *)"
                          ;
                          goto LAB_0011c7bd;
                        }
                        if (5 < (int)local_124) {
                          uStack_140 = CONCAT62(uStack_140._2_6_,local_14a);
                          local_138._0_6_ = CONCAT24(sVar22,uVar2);
                          local_138 = CONCAT26(uVar7,(undefined6)local_138);
                          __assert_fail("infos[e1_3_gobbo].atom_ix < NUM_BB_ATOM",
                                        "/workspace/llm4binary/github/license_all_cmakelists_25/uic-lianglab[P]ompg-public/source/collision_frontend.cpp"
                                        ,0x8c,
                                        "int (anonymous namespace)::gobbo_are_1_3_connected(const struct atom_info *)"
                                       );
                        }
                        uVar10 = (ulong)(local_11c < (int)uVar16);
                        uVar6 = (ulong)((int)uVar16 <= local_11c);
                        uVar19 = 0;
                        iVar25 = (int)((long)local_148[uVar10 * 3] - (long)local_148[uVar6 * 3]);
                        if (iVar25 < 2) {
                          uVar17 = local_b8;
                          pSVar18 = local_108;
                          if ((int)uVar2 < 6) {
                            uVar19 = *(uint *)((anonymous_namespace)::bb_1_3 +
                                              ((long)local_148[uVar10 * 3 + 1] +
                                              ((long)local_148[uVar10 * 3] -
                                              (long)local_148[uVar6 * 3]) * 6) * 4 +
                                              (long)local_148[uVar6 * 3 + 1] * 0x30);
                          }
                          else {
                            if (iVar25 != 1) {
                              uStack_140 = CONCAT62(uStack_140._2_6_,local_14a);
                              local_138._0_6_ = CONCAT24(sVar22,uVar2);
                              local_138 = CONCAT26(uVar7,(undefined6)local_138);
                              __assert_fail("delta_res == 1",
                                            "/workspace/llm4binary/github/license_all_cmakelists_25/uic-lianglab[P]ompg-public/source/collision_frontend.cpp"
                                            ,0xb1,
                                            "int (anonymous namespace)::gobbo_are_1_3_connected(const struct atom_info *)"
                                           );
                            }
                            local_125 = local_11c < (int)uVar16;
                            uVar19 = (uint)(((uVar2 == 7 && local_124 == 2) && (bool)local_125) &&
                                           sVar22 == 0xc);
                          }
                        }
                        if ((uVar19 != 0) ||
                           (((iVar25 == 1 && (local_148[uVar10 * 3 + 1] == 1)) &&
                            (local_148[uVar6 * 3 + 1] == 3)))) goto LAB_0011c2a2;
                      }
                      iVar8 = anon_unknown.dwarf_204a4::atoms_overlap
                                        (local_70,pAVar15 + uVar2,
                                         local_e0->m_ofac2[local_c8 - uVar16 < 0xfffffffd]);
                      if (iVar8 == 0) {
                        iVar8 = 0;
                      }
                      else {
                        local_100 = (ulong)((int)local_100 + local_d0);
                        local_118 = (ulong)((int)local_118 + local_cc);
                        iVar8 = 0xb;
                      }
                    }
LAB_0011c2a2:
                  } while (((iVar8 == 0xd) || (iVar8 == 0)) &&
                          (lVar20 = lVar20 + 1, lVar13 + (ulong)(lVar13 == 0) != lVar20));
                }
                pRVar21 = local_78;
                uVar16 = local_124;
                if (local_f8.
                    super__Vector_base<collision_grid_prot::atom_key,_std::allocator<collision_grid_prot::atom_key>_>
                    ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
                  operator_delete(local_f8.
                                  super__Vector_base<collision_grid_prot::atom_key,_std::allocator<collision_grid_prot::atom_key>_>
                                  ._M_impl.super__Vector_impl_data._M_start);
                  pRVar21 = local_78;
                  uVar16 = local_124;
                }
              }
              sVar23 = (short)uVar24 + 1;
              uVar24 = (uint)sVar23;
            } while (sVar23 < pRVar21->_numAtom);
          }
          local_124 = uVar16;
          poVar11 = std::__ostream_insert<char,std::char_traits<char>>
                              ((ostream *)&std::cout,
                               Residue::Name3_abi_cxx11_[pRVar21->_type]._M_dataplus._M_p,
                               Residue::Name3_abi_cxx11_[pRVar21->_type]._M_string_length);
          std::__ostream_insert<char,std::char_traits<char>>(poVar11,":",1);
          poVar11 = std::ostream::_M_insert<unsigned_long>((ulong)poVar11);
          std::__ostream_insert<char,std::char_traits<char>>(poVar11,",",1);
          iVar25 = (int)local_100;
          poVar11 = (ostream *)std::ostream::operator<<(poVar11,iVar25);
          std::__ostream_insert<char,std::char_traits<char>>(poVar11,",",1);
          iVar8 = (int)local_118;
          poVar11 = (ostream *)std::ostream::operator<<(poVar11,iVar8);
          std::__ostream_insert<char,std::char_traits<char>>(poVar11,",",1);
          poVar11 = (ostream *)std::ostream::operator<<(poVar11,iVar8 + iVar25);
          std::__ostream_insert<char,std::char_traits<char>>(poVar11,",",1);
          iVar8 = local_120;
          plVar12 = (long *)std::ostream::operator<<(poVar11,local_120);
          std::ios::widen((char)*(undefined8 *)(*plVar12 + -0x18) + (char)plVar12);
          std::ostream::put((char)plVar12);
          std::ostream::flush();
          uVar10 = (ulong)(uint)((int)local_98 + iVar25);
          iVar25 = local_d8 + (int)local_118;
          iVar8 = local_d4 + iVar8;
          uVar17 = uVar17 + 1;
          uVar16 = local_124;
        } while (uVar17 <= (ulong)(long)(local_c0->super__Vector_base<int,_std::allocator<int>_>).
                                        _M_impl.super__Vector_impl_data._M_start[local_a0]);
        uStack_140 = CONCAT62(uStack_140._2_6_,local_14a);
        local_138._0_6_ = CONCAT24(sVar22,(undefined4)local_138);
        lVar13 = local_b0;
        lVar20 = local_a0;
        starts = local_a8;
      }
      lVar20 = lVar20 + 1;
    } while (lVar20 != lVar13);
  }
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cout,"TOTAL BB CLASHES: ",0x12);
  plVar12 = (long *)std::ostream::operator<<(&std::cout,(int)uVar10);
  std::ios::widen((char)*(undefined8 *)(*plVar12 + -0x18) + (char)plVar12);
  std::ostream::put((char)plVar12);
  std::ostream::flush();
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cout,"TOTAL SC CLASHES: ",0x12);
  plVar12 = (long *)std::ostream::operator<<(&std::cout,iVar25);
  std::ios::widen((char)*(undefined8 *)(*plVar12 + -0x18) + (char)plVar12);
  std::ostream::put((char)plVar12);
  std::ostream::flush();
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cout,"TOTAL MEMB CLASHES: ",0x14);
  plVar12 = (long *)std::ostream::operator<<(&std::cout,iVar8);
  std::ios::widen((char)*(undefined8 *)(*plVar12 + -0x18) + (char)plVar12);
  std::ostream::put((char)plVar12);
  std::ostream::flush();
  return;
}

Assistant:

void CollisionFrontend::print_broad_clash_counts(const class Structure &Conf,
    const std::vector<int> &starts,
    const std::vector<int> &ends,
    const bool b_ignore_self) const {
 
    assert(starts.size() == ends.size());   
    std::cout << "res,bbc,scc,tot,mc\n";
    
    // Structure used for detecting whether two backbone atoms are within two bonds or
    // less of each other
    struct atom_info infos[e1_3_num] = { 0 };

    // The overlap factor: If the ratio of distance between two atoms centers
    // to the sum of their atomic radii is less than this value, then the atoms
    // are colliding.
    double ofac2 = 1.0;
    
    const size_t num_loops = starts.size();

    // Total number of loop backbone atoms that clash with protein
    int total_bb_clashes = 0;
    // Total number of loop side chain atoms that clash with protein
    int total_sc_clashes = 0;
    // Total number of loop atoms that clash with membrane
    int total_memb_clashes = 0;

    for (size_t i_loop = 0; i_loop < num_loops; ++i_loop) {
        for (size_t i_res = starts[i_loop]; i_res <= ends[i_loop]; ++i_res) {
            const Residue &res = Conf._res[i_res];
            assert(res._posn == i_res);

            // Total number of backbone atoms at this residue that clash with protein
            int bb_clashes = 0;
            // Total number of side chain atoms at this residue that clash with protein
            int sc_clashes = 0;
            // Total number of atoms at this residue that clash with membrane
            int memb_clashes = 0;

            for (short i_atom = 0; i_atom < res._numAtom; ++i_atom) {
                // Obtain handle to atom
                const Atom &atom = res._atom[i_atom];
                if (VdwUtils::should_ignore_atom(atom)) {
                    continue;
                }

                // 1-3 collision filter for backbone atoms
                const bool is_bb_atom = (i_atom < NUM_BB_ATOM);
                if (is_bb_atom) {
                    infos[e1_3_gobbo].res_ix = static_cast<int>(i_res);
                    assert(infos[e1_3_gobbo].res_ix >= 1);
                    assert(infos[e1_3_gobbo].res_ix <= Conf._numRes);
                    infos[e1_3_gobbo].atom_ix = i_atom;
                    infos[e1_3_gobbo].res_type = Conf._res[infos[e1_3_gobbo].res_ix]._type;
                }

                // Check against membrane
                if (m_membrane.collides(atom, m_ofac2[eIxOFAC_memb])) {
                    ++memb_clashes;
                }

                // Broad phase
                collision_grid_prot::filter_results_t nearby_atoms;
                m_broad_phase.filter(nearby_atoms,
                                     atom.x, atom.y, atom.z,
                                     collision_grid_prot::elem_radius(atom));

                // Narrow phase
                const size_t num_nearby_atoms = nearby_atoms.size();
                for (size_t i_nearby_atom = 0; i_nearby_atom < num_nearby_atoms; ++i_nearby_atom) {
                    const collision_grid_prot::atom_key &nearby_atom_key = nearby_atoms[i_nearby_atom];
                    assert(nearby_atom_key.res_ix >= 1);
                    assert(nearby_atom_key.res_ix <= static_cast<unsigned int>(Conf._numRes));
                    assert(nearby_atom_key.atom_ix >= 0);
                    assert(nearby_atom_key.atom_ix < static_cast<unsigned int>(Conf._res[nearby_atom_key.res_ix]._numAtom));
                    const Atom &nearby_atom = Conf._res[nearby_atom_key.res_ix]._atom[nearby_atom_key.atom_ix];
                    assert(!VdwUtils::should_ignore_atom(nearby_atom));

                    // Skip self residues
                    if (b_ignore_self && (nearby_atom_key.res_ix == i_res)) {
                        continue;
                    }

                    // Skip if 1-3 connected (connected within at most 2 bonds)
                    // only supported if first atom is backbone atom
                    if (is_bb_atom)
                    {
                        infos[e1_3_alt].res_ix = nearby_atom_key.res_ix;
                        infos[e1_3_alt].atom_ix = nearby_atom_key.atom_ix;
                        infos[e1_3_alt].res_type = Conf._res[nearby_atom_key.res_ix]._type;
                        if (gobbo_are_1_3_connected(infos)) {
                            continue;
                        }

                        // HACK: Ca+1 and carbonyl O always seem to clash,
                        // even in native structure so ignore that specific interaction
                        if (hack_ignore_Ca1_with_O_clash(infos)) {
                            continue;
                        }
                    }

                    // Check for overlap
                    ofac2 = get_ofac2(static_cast<int>(i_res), static_cast<int>(nearby_atom_key.res_ix));
                    if (atoms_overlap(atom, nearby_atom, ofac2)) {
                        if (is_bb_atom) {
                            ++bb_clashes;
                        }
                        else {
                            ++sc_clashes;
                        }
                        // Check next atom for clashes
                        break;
                    }
                } // end narrow phase check

            } // end iteration over atoms

            std::cout << res.get_name_3() << ":" << i_res << ","
                      << bb_clashes << ","
                      << sc_clashes << ","
                      << bb_clashes + sc_clashes << ","
                      << memb_clashes << std::endl;

            total_bb_clashes += bb_clashes;
            total_sc_clashes += sc_clashes;
            total_memb_clashes += memb_clashes;

        } // end iteration over residues
    } // end iteration over loops

    std::cout << "TOTAL BB CLASHES: " << total_bb_clashes << std::endl;
    std::cout << "TOTAL SC CLASHES: " << total_sc_clashes << std::endl;
    std::cout << "TOTAL MEMB CLASHES: " << total_memb_clashes << std::endl;
}